

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ssize_t __thiscall
cplus::socket::Socket::recv(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int __fd_00;
  char *__buf_00;
  size_t size;
  undefined4 in_register_00000034;
  ssize_t readSize;
  int flags_local;
  size_t bufferSize_local;
  Socket *this_local;
  
  lang::ByteArray::setSize(&this->buffer,CONCAT44(in_register_00000034,__fd));
  lang::ByteArray::fillWithZero(&this->buffer);
  __fd_00 = this->socket;
  __buf_00 = lang::ByteArray::getBuffer(&this->buffer);
  size = ::recv(__fd_00,__buf_00,CONCAT44(in_register_00000034,__fd),(int)__buf);
  if (size != 0xffffffffffffffff) {
    lang::ByteArray::setSize(&this->buffer,size);
  }
  this_local = (Socket *)&this->buffer;
  return (ssize_t)this_local;
}

Assistant:

lang::ByteArray &Socket::recv(size_t bufferSize, int flags) {
			buffer.setSize(bufferSize);
			buffer.fillWithZero();
			auto readSize = ::recv(socket, buffer.getBuffer(), bufferSize, flags);
			if (readSize == -1)
				return buffer;
			buffer.setSize(static_cast<size_t>(readSize));
			return buffer;
		}